

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

int8_t mpack_node_i8(mpack_node_t node)

{
  anon_union_8_7_c87e5bf0_for_value aVar1;
  mpack_node_data_t *pmVar2;
  
  pmVar2 = node.data;
  if ((node.tree)->error == mpack_ok) {
    if (pmVar2->type == mpack_type_int) {
      aVar1 = pmVar2->value;
      if (aVar1.b == aVar1.i) goto LAB_00104934;
    }
    else if ((pmVar2->type == mpack_type_uint) && (aVar1 = pmVar2->value, aVar1.u < 0x80))
    goto LAB_00104934;
    mpack_tree_flag_error(node.tree,mpack_error_type);
    return '\0';
  }
  aVar1.d = 0.0;
LAB_00104934:
  return aVar1._0_1_;
}

Assistant:

MPACK_INLINE int8_t mpack_node_i8(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= INT8_MAX)
            return (int8_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= INT8_MIN && node.data->value.i <= INT8_MAX)
            return (int8_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}